

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

bool __thiscall GraphLibrary::Graph::has_edge(Graph *this,Node v,Node w)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  uint in_ESI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc8;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](in_RDI,(ulong)in_ESI);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      (in_stack_ffffffffffffffb8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](in_RDI,(ulong)in_ESI);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffb8);
  std::
  find<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
            ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](in_RDI,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_ffffffffffffffb8);
  return bVar1;
}

Assistant:

bool Graph::has_edge(const Node v, const Node w) const {
        if (find(m_adjacency_lists[v].begin(), m_adjacency_lists[v].end(), w) != m_adjacency_lists[v].end()) {
            return true;
        } else {
            return false;
        }
    }